

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O0

void __thiscall V2MPlayer::Play(V2MPlayer *this,uint32_t a_time)

{
  uint uVar1;
  bool bVar2;
  uint32_t local_1c;
  uint32_t cursmpl;
  uint32_t destsmpl;
  uint32_t a_time_local;
  V2MPlayer *this_local;
  
  if ((((this->m_base).valid & 1U) != 0) && (this->m_samplerate != 0)) {
    Stop(this,0);
    Reset(this);
    (this->m_base).valid = false;
    local_1c = 0;
    uVar1 = (uint)(((ulong)a_time * (ulong)this->m_samplerate) / (ulong)this->m_tpc);
    (this->m_state).state = PLAYING;
    (this->m_state).smpldelta = 0;
    (this->m_state).smplrem = 0;
    while( true ) {
      bVar2 = false;
      if (local_1c + (this->m_state).smpldelta < uVar1) {
        bVar2 = (this->m_state).state == PLAYING;
      }
      if (!bVar2) break;
      local_1c = (this->m_state).smpldelta + local_1c;
      Tick(this);
      if ((this->m_state).state == PLAYING) {
        (this->m_state).smpldelta = 0;
        anon_unknown.dwarf_1f3e::UpdateSampleDelta
                  ((this->m_state).nexttime,(this->m_state).time,(this->m_state).usecs,
                   (this->m_base).timediv2,&(this->m_state).smplrem,&(this->m_state).smpldelta);
      }
      else {
        (this->m_state).smpldelta = 0xffffffff;
      }
    }
    (this->m_state).cursmpl = local_1c;
    (this->m_state).smpldelta = (this->m_state).smpldelta - (uVar1 - local_1c);
    this->m_fadeval = 1.0;
    this->m_fadedelta = 0.0;
    (this->m_base).valid = true;
  }
  return;
}

Assistant:

void V2MPlayer::Play(uint32_t a_time)
{
    if (!m_base.valid || !m_samplerate)
        return;

    Stop();
    Reset();

    m_base.valid = sFALSE;
    uint32_t destsmpl, cursmpl = 0;
    {
        destsmpl = ((uint64_t)a_time * m_samplerate) / m_tpc;
    }

    m_state.state = PlayerState::PLAYING;
    m_state.smpldelta = 0;
    m_state.smplrem = 0;
    while ((cursmpl + m_state.smpldelta) < destsmpl && m_state.state == PlayerState::PLAYING)
    {
        cursmpl += m_state.smpldelta;
        Tick();
        if (m_state.state == PlayerState::PLAYING) {
            m_state.smpldelta = 0;
            UpdateSampleDelta(m_state.nexttime, m_state.time, m_state.usecs, m_base.timediv2, &m_state.smplrem, &m_state.smpldelta);
        } else
            m_state.smpldelta = -1;
    }

    m_state.cursmpl    = cursmpl;
    m_state.smpldelta -= (destsmpl - cursmpl);
    m_fadeval    = 1.0f;
    m_fadedelta  = 0.0f;
    m_base.valid = sTRUE;
}